

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

int still_chewing(xchar x,xchar y)

{
  level *plVar1;
  boolean bVar2;
  schar sVar3;
  int iVar4;
  obj *poVar5;
  char *pcVar6;
  bool bVar7;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_30;
  char *dmgtxt;
  char *digtxt;
  obj *boulder;
  rm *loc;
  xchar y_local;
  xchar x_local;
  
  plVar1 = level;
  poVar5 = sobj_at(0x214,level,(int)x,(int)y);
  dmgtxt = (char *)0x0;
  local_30 = (char *)0x0;
  if (digging.down != '\0') {
    memset(&digging,0,0x10);
  }
  if (((poVar5 == (obj *)0x0) && (plVar1->locations[x][y].typ < '\x11')) &&
     (bVar2 = may_dig(level,x,y), bVar2 == '\0')) {
    bVar7 = true;
    if ((plVar1->locations[x][y].typ != '\r') &&
       (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) == 0 ||
        (bVar7 = true, plVar1->locations[x][y].typ != '\0')))) {
      bVar7 = plVar1->locations[x][y].typ == '\x0e';
    }
    pcVar6 = "hard stone";
    if (bVar7) {
      pcVar6 = "tree";
    }
    pline("You hurt your teeth on the %s.",pcVar6);
    nomul(0,(char *)0x0);
    loc._4_4_ = 1;
  }
  else if (((digging.pos.x == x) && (digging.pos.y == y)) &&
          (bVar2 = on_level(&digging.level,&u.uz), bVar2 != '\0')) {
    digging.effort = u.udaminc + 0x1e + digging.effort;
    if (digging.effort < 0x65) {
      if (flags.verbose != '\0') {
        pcVar6 = "begin";
        if (digging.chew != '\0') {
          pcVar6 = "continue";
        }
        if (poVar5 == (obj *)0x0) {
          if (plVar1->locations[x][y].typ == '\x16') {
            local_68 = "bars";
          }
          else {
            if (((plVar1->locations[x][y].typ == '\r') ||
                (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 &&
                 (plVar1->locations[x][y].typ == '\0')))) || (plVar1->locations[x][y].typ == '\x0e')
               ) {
              local_70 = "tree";
            }
            else {
              local_70 = "door";
              if (plVar1->locations[x][y].typ < '\x11') {
                local_70 = "rock";
              }
            }
            local_68 = local_70;
          }
          local_60 = local_68;
        }
        else {
          local_60 = "boulder";
        }
        pline("You %s chewing on the %s.",pcVar6,local_60);
      }
      digging.chew = '\x01';
      watch_dig((monst *)0x0,x,y,'\0');
      loc._4_4_ = 1;
    }
    else {
      violated(5);
      iVar4 = rnd(0x14);
      u.uhunger = iVar4 + u.uhunger;
      if (poVar5 == (obj *)0x0) {
        if ((plVar1->locations[x][y].typ == '\0') || ('\f' < plVar1->locations[x][y].typ)) {
          if ((plVar1->locations[x][y].typ == '\r') ||
             (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 &&
              (plVar1->locations[x][y].typ == '\0')))) {
            dmgtxt = "You chew through the tree.";
            plVar1->locations[x][y].typ = '\x19';
          }
          else if (plVar1->locations[x][y].typ == '\x16') {
            dmgtxt = "You chew through the iron bars.";
            dissolve_bars((int)x,(int)y);
            if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
              sokoban_trickster();
            }
          }
          else if (plVar1->locations[x][y].typ == '\x0f') {
            if ((*(uint *)&plVar1->locations[x][y].field_0x6 >> 4 & 0x10) == 0) {
              dmgtxt = "You chew through the secret door.";
              *(uint *)&plVar1->locations[x][y].field_0x6 =
                   *(uint *)&plVar1->locations[x][y].field_0x6 & 0xfffffe0f | 0x10;
            }
            else {
              *(uint *)&plVar1->locations[x][y].field_0x6 =
                   *(uint *)&plVar1->locations[x][y].field_0x6 & 0xfffffe0f;
              b_trapped("secret door",0);
            }
            plVar1->locations[x][y].typ = '\x17';
          }
          else if (plVar1->locations[x][y].typ == '\x17') {
            pcVar6 = in_rooms(level,x,y,0x12);
            if (*pcVar6 != '\0') {
              add_damage(x,y,400);
              local_30 = "break";
            }
            if ((*(uint *)&plVar1->locations[x][y].field_0x6 >> 4 & 0x10) == 0) {
              dmgtxt = "You chew through the door.";
              *(uint *)&plVar1->locations[x][y].field_0x6 =
                   *(uint *)&plVar1->locations[x][y].field_0x6 & 0xfffffe0f | 0x10;
            }
            else {
              *(uint *)&plVar1->locations[x][y].field_0x6 =
                   *(uint *)&plVar1->locations[x][y].field_0x6 & 0xfffffe0f;
              b_trapped("door",0);
            }
          }
          else {
            dmgtxt = "You chew a passage through the rock.";
            plVar1->locations[x][y].typ = '\x18';
          }
        }
        else {
          pcVar6 = in_rooms(level,x,y,0x12);
          if (*pcVar6 != '\0') {
            sVar3 = acurrstr();
            add_damage(x,y,(long)sVar3 * 10);
            local_30 = "damage";
          }
          dmgtxt = "You chew a hole in the wall.";
          if ((*(uint *)&(level->flags).field_0x8 >> 0x11 & 1) == 0) {
            if (((*(uint *)&(level->flags).field_0x8 >> 0x13 & 1) == 0) ||
               (bVar2 = in_town((int)x,(int)y), bVar2 != '\0')) {
              plVar1->locations[x][y].typ = '\x17';
              *(uint *)&plVar1->locations[x][y].field_0x6 =
                   *(uint *)&plVar1->locations[x][y].field_0x6 & 0xfffffe0f;
            }
            else {
              plVar1->locations[x][y].typ = '\x18';
            }
          }
          else {
            plVar1->locations[x][y].typ = '\x19';
          }
        }
      }
      else {
        delobj(poVar5);
        pline("You eat the boulder.");
        if (((plVar1->locations[x][y].typ < '\x11') ||
            (bVar2 = closed_door(level,(int)x,(int)y), bVar2 != '\0')) ||
           (poVar5 = sobj_at(0x214,level,(int)x,(int)y), poVar5 != (obj *)0x0)) {
          block_point((int)x,(int)y);
          memset(&digging,0,0x10);
          return 1;
        }
      }
      unblock_point((int)x,(int)y);
      newsym((int)x,(int)y);
      if (dmgtxt != (char *)0x0) {
        pline(dmgtxt);
      }
      if (local_30 != (char *)0x0) {
        pay_for_damage(local_30,'\0');
      }
      memset(&digging,0,0x10);
      loc._4_4_ = 0;
    }
  }
  else {
    digging.down = '\0';
    digging.chew = '\x01';
    digging.warned = '\0';
    digging.pos.x = x;
    digging.pos.y = y;
    assign_level(&digging.level,&u.uz);
    bVar7 = false;
    if (plVar1->locations[x][y].typ < '\x11') {
      bVar7 = true;
      if ((plVar1->locations[x][y].typ != '\r') &&
         (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) == 0 ||
          (bVar7 = true, plVar1->locations[x][y].typ != '\0')))) {
        bVar7 = plVar1->locations[x][y].typ == '\x0e';
      }
      bVar7 = (bool)(bVar7 ^ 1);
    }
    iVar4 = 0x3c;
    if (bVar7) {
      iVar4 = 0x1e;
    }
    digging.effort = iVar4 + u.udaminc;
    if (poVar5 == (obj *)0x0) {
      if (plVar1->locations[x][y].typ == '\x16') {
        local_48 = "on the iron bars";
      }
      else {
        if ((plVar1->locations[x][y].typ == '\r') ||
           ((((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 &&
             (plVar1->locations[x][y].typ == '\0')) || (plVar1->locations[x][y].typ == '\x0e')))) {
          local_50 = "on a tree";
        }
        else {
          local_50 = "a hole in the door";
          if (plVar1->locations[x][y].typ < '\x11') {
            local_50 = "a hole in the rock";
          }
        }
        local_48 = local_50;
      }
      local_40 = local_48;
    }
    else {
      local_40 = "on a boulder";
    }
    pline("You start chewing %s.",local_40);
    watch_dig((monst *)0x0,x,y,'\0');
    loc._4_4_ = 1;
  }
  return loc._4_4_;
}

Assistant:

static int still_chewing(xchar x, xchar y)
{
    struct rm *loc = &level->locations[x][y];
    struct obj *boulder = sobj_at(BOULDER, level, x,y);
    const char *digtxt = NULL, *dmgtxt = NULL;

    if (digging.down)		/* not continuing previous dig (w/ pick-axe) */
	memset(&digging, 0, sizeof digging);

    if (!boulder && IS_ROCK(loc->typ) && !may_dig(level, x,y)) {
	pline("You hurt your teeth on the %s.",
	      IS_TREES(level, loc->typ) ? "tree" : "hard stone");
	nomul(0, NULL);
	return 1;
    } else if (digging.pos.x != x || digging.pos.y != y ||
		!on_level(&digging.level, &u.uz)) {
	digging.down = FALSE;
	digging.chew = TRUE;
	digging.warned = FALSE;
	digging.pos.x = x;
	digging.pos.y = y;
	assign_level(&digging.level, &u.uz);
	/* solid rock takes more work & time to dig through */
	digging.effort = (IS_ROCK(loc->typ) && !IS_TREES(level, loc->typ) ?
			  30 : 60) + u.udaminc;
	pline("You start chewing %s.",
	      boulder ? "on a boulder" :
	      loc->typ == IRONBARS ? "on the iron bars" :
	      IS_TREES(level, loc->typ) ? "on a tree" :
	      IS_ROCK(loc->typ) ? "a hole in the rock" :
	      "a hole in the door");
	watch_dig(NULL, x, y, FALSE);
	return 1;
    } else if ((digging.effort += (30 + u.udaminc)) <= 100)  {
	if (flags.verbose)
	    pline("You %s chewing on the %s.",
		digging.chew ? "continue" : "begin",
		boulder ? "boulder" :
		loc->typ == IRONBARS ? "bars" :
		IS_TREES(level, loc->typ) ? "tree" :
		IS_ROCK(loc->typ) ? "rock" : "door");
	digging.chew = TRUE;
	watch_dig(NULL, x, y, FALSE);
	return 1;
    }

    /* Okay, you've chewed through something */
    violated(CONDUCT_FOODLESS);
    u.uhunger += rnd(20);

    if (boulder) {
	delobj(boulder);		/* boulder goes bye-bye */
	pline("You eat the boulder.");	/* yum */

	/*
	 *  The location could still block because of
	 *	1. More than one boulder
	 *	2. Boulder stuck in a wall/stone/door.
	 *
	 *  [perhaps use does_block() below (from vision.c)]
	 */
	if (IS_ROCK(loc->typ) || closed_door(level, x,y) || sobj_at(BOULDER, level, x,y)) {
	    block_point(x,y);	/* delobj will unblock the point */
	    /* reset dig state */
	    memset(&digging, 0, sizeof digging);
	    return 1;
	}

    } else if (IS_WALL(loc->typ)) {
	if (*in_rooms(level, x, y, SHOPBASE)) {
	    add_damage(x, y, 10L * ACURRSTR);
	    dmgtxt = "damage";
	}
	digtxt = "You chew a hole in the wall.";
	if (level->flags.is_maze_lev) {
	    loc->typ = ROOM;
	} else if (level->flags.is_cavernous_lev && !in_town(x, y)) {
	    loc->typ = CORR;
	} else {
	    loc->typ = DOOR;
	    loc->doormask = D_NODOOR;
	}
    } else if (IS_TREE(level, loc->typ)) {
	digtxt = "You chew through the tree.";
	loc->typ = ROOM;
    } else if (loc->typ == IRONBARS) {
	digtxt = "You chew through the iron bars.";
	dissolve_bars(x, y);
	if (In_sokoban(&u.uz))
	    sokoban_trickster();
    } else if (loc->typ == SDOOR) {
	if (loc->doormask & D_TRAPPED) {
	    loc->doormask = D_NODOOR;
	    b_trapped("secret door", 0);
	} else {
	    digtxt = "You chew through the secret door.";
	    loc->doormask = D_BROKEN;
	}
	loc->typ = DOOR;

    } else if (IS_DOOR(loc->typ)) {
	if (*in_rooms(level, x, y, SHOPBASE)) {
	    add_damage(x, y, 400L);
	    dmgtxt = "break";
	}
	if (loc->doormask & D_TRAPPED) {
	    loc->doormask = D_NODOOR;
	    b_trapped("door", 0);
	} else {
	    digtxt = "You chew through the door.";
	    loc->doormask = D_BROKEN;
	}

    } else { /* STONE or SCORR */
	digtxt = "You chew a passage through the rock.";
	loc->typ = CORR;
    }

    unblock_point(x, y);	/* vision */
    newsym(x, y);
    if (digtxt) pline(digtxt);	/* after newsym */
    if (dmgtxt) pay_for_damage(dmgtxt, FALSE);
    memset(&digging, 0, sizeof digging);
    return 0;
}